

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void ts_parser__set_cached_token
               (TSParser *self,size_t byte_index,Subtree last_external_token,Subtree token)

{
  Subtree SVar1;
  
  if (token.ptr != (SubtreeHeapData *)0x0) {
    ts_subtree_retain(token);
  }
  if (last_external_token.ptr != (SubtreeHeapData *)0x0) {
    ts_subtree_retain(last_external_token);
  }
  SVar1 = (self->token_cache).token;
  if (SVar1.ptr != (SubtreeHeapData *)0x0) {
    ts_subtree_release(&self->tree_pool,SVar1);
  }
  SVar1 = (self->token_cache).last_external_token;
  if (SVar1.ptr != (SubtreeHeapData *)0x0) {
    ts_subtree_release(&self->tree_pool,SVar1);
  }
  (self->token_cache).token = token;
  (self->token_cache).byte_index = (uint32_t)byte_index;
  (self->token_cache).last_external_token = last_external_token;
  return;
}

Assistant:

static void ts_parser__set_cached_token(TSParser *self, size_t byte_index,
                                        Subtree last_external_token,
                                        Subtree token) {
  TokenCache *cache = &self->token_cache;
  if (token.ptr) ts_subtree_retain(token);
  if (last_external_token.ptr) ts_subtree_retain(last_external_token);
  if (cache->token.ptr) ts_subtree_release(&self->tree_pool, cache->token);
  if (cache->last_external_token.ptr) ts_subtree_release(&self->tree_pool, cache->last_external_token);
  cache->token = token;
  cache->byte_index = byte_index;
  cache->last_external_token = last_external_token;
}